

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrImpl.cpp
# Opt level: O1

int __thiscall xercesc_4_0::DOMAttrImpl::rename(DOMAttrImpl *this,char *__old,char *__new)

{
  short *psVar1;
  short *psVar2;
  DOMDocument *pDVar3;
  int iVar4;
  undefined4 extraout_var;
  DOMAttrImpl *dst;
  long *plVar5;
  long lVar6;
  DOMNodeImpl *pDVar7;
  ulong uVar8;
  DOMNodeImpl *n2;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar9;
  DOMStringPoolEntry *pDVar10;
  DOMException *this_00;
  XMLSize_t XVar11;
  ushort *puVar12;
  ushort uVar13;
  XMLCh *target;
  DOMStringPoolEntry *pDVar14;
  DOMDocumentImpl *this_01;
  undefined4 extraout_var_00;
  undefined4 extraout_var_03;
  
  iVar4 = (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[0x2c])();
  plVar9 = (long *)CONCAT44(extraout_var,iVar4);
  pDVar3 = (this->fParent).fOwnerDocument;
  this_01 = (DOMDocumentImpl *)&pDVar3[-1].super_DOMNode;
  if (pDVar3 == (DOMDocument *)0x0) {
    this_01 = (DOMDocumentImpl *)0x0;
  }
  if (plVar9 != (long *)0x0) {
    (**(code **)(*plVar9 + 0x170))(plVar9,this);
  }
  if ((__old == (char *)0x0) || (*(short *)__old == 0)) {
    if (__new == (char *)0x0) {
      target = (XMLCh *)0x0;
    }
    else {
      lVar6 = 0;
      do {
        psVar1 = (short *)(__new + lVar6);
        lVar6 = lVar6 + 2;
      } while (*psVar1 != 0);
      uVar8 = (ulong)*(ushort *)__new;
      if (uVar8 == 0) {
        uVar8 = 0;
      }
      else {
        uVar13 = *(ushort *)(__new + 2);
        if (uVar13 != 0) {
          puVar12 = (ushort *)(__new + 4);
          do {
            uVar8 = (ulong)uVar13 + (uVar8 >> 0x18) + uVar8 * 0x26;
            uVar13 = *puVar12;
            puVar12 = puVar12 + 1;
          } while (uVar13 != 0);
        }
        uVar8 = uVar8 % this_01->fNameTableSize;
      }
      XVar11 = (lVar6 >> 1) - 1;
      pDVar10 = this_01->fNameTable[uVar8];
      if (pDVar10 == (DOMStringPoolEntry *)0x0) {
        pDVar14 = (DOMStringPoolEntry *)(this_01->fNameTable + uVar8);
      }
      else {
        do {
          pDVar14 = pDVar10;
          if (pDVar14->fLength == XVar11) {
            target = pDVar14->fString;
            if (target == (XMLCh *)__new) goto LAB_00261fcd;
            lVar6 = 0;
            do {
              psVar1 = (short *)((long)target + lVar6);
              if (*psVar1 == 0) {
                if (*(short *)(__new + lVar6) == 0) goto LAB_00261fcd;
                break;
              }
              psVar2 = (short *)(__new + lVar6);
              lVar6 = lVar6 + 2;
            } while (*psVar1 == *psVar2);
          }
          pDVar10 = pDVar14->fNext;
        } while (pDVar14->fNext != (DOMStringPoolEntry *)0x0);
      }
      iVar4 = (*(this_01->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                        (this_01,XVar11 * 2 + 0x18);
      pDVar10 = (DOMStringPoolEntry *)CONCAT44(extraout_var_03,iVar4);
      pDVar14->fNext = pDVar10;
      pDVar10->fLength = XVar11;
      pDVar10->fNext = (DOMStringPoolEntry *)0x0;
      target = pDVar10->fString;
      XMLString::copyString(target,(XMLCh *)__new);
    }
LAB_00261fcd:
    this->fName = target;
    if (plVar9 != (long *)0x0) {
      (**(code **)(*plVar9 + 0x168))(plVar9,this);
    }
    plVar9 = (long *)__dynamic_cast(this,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                    0xfffffffffffffffe);
    if ((plVar9 != (long *)0x0) && (lVar6 = (**(code **)(*plVar9 + 0x10))(plVar9), lVar6 != 0)) {
      pDVar7 = (DOMNodeImpl *)(**(code **)(*plVar9 + 0x10))(plVar9);
      DOMNodeImpl::callUserDataHandlers(pDVar7,NODE_RENAMED,(DOMNode *)this,(DOMNode *)this);
LAB_00262035:
      return (int)this;
    }
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
  }
  else {
    iVar4 = (*(this_01->super_DOMMemoryManager)._vptr_DOMMemoryManager[0x53])(this_01,__old,__new);
    dst = (DOMAttrImpl *)CONCAT44(extraout_var_00,iVar4);
    plVar5 = (long *)__dynamic_cast(this,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                    0xfffffffffffffffe);
    if ((plVar5 == (long *)0x0) || (lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5), lVar6 == 0)) {
      this_00 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
    }
    else {
      pDVar7 = (DOMNodeImpl *)(**(code **)(*plVar5 + 0x10))(plVar5);
      if (dst == (DOMAttrImpl *)0x0) {
        plVar5 = (long *)0x0;
      }
      else {
        plVar5 = (long *)__dynamic_cast(dst,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                        0xfffffffffffffffe);
      }
      if ((plVar5 == (long *)0x0) || (lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5), lVar6 == 0)) {
        this_00 = (DOMException *)__cxa_allocate_exception(0x28);
        DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
      }
      else {
        n2 = (DOMNodeImpl *)(**(code **)(*plVar5 + 0x10))(plVar5);
        DOMDocumentImpl::transferUserData(this_01,pDVar7,n2);
        iVar4 = (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[7])(this);
        lVar6 = CONCAT44(extraout_var_01,iVar4);
        while (lVar6 != 0) {
          (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[0x10])(this,lVar6);
          (*(dst->super_DOMAttr).super_DOMNode._vptr_DOMNode[0x11])(dst,lVar6);
          iVar4 = (*(this->super_DOMAttr).super_DOMNode._vptr_DOMNode[7])(this);
          lVar6 = CONCAT44(extraout_var_02,iVar4);
        }
        if (plVar9 != (long *)0x0) {
          (**(code **)(*plVar9 + 0x1a0))(plVar9,dst);
        }
        if (dst == (DOMAttrImpl *)0x0) {
          plVar9 = (long *)0x0;
        }
        else {
          plVar9 = (long *)__dynamic_cast(dst,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                          0xfffffffffffffffe);
        }
        if ((plVar9 != (long *)0x0) && (lVar6 = (**(code **)(*plVar9 + 0x10))(plVar9), lVar6 != 0))
        {
          pDVar7 = (DOMNodeImpl *)(**(code **)(*plVar9 + 0x10))(plVar9);
          DOMNodeImpl::callUserDataHandlers(pDVar7,NODE_RENAMED,(DOMNode *)this,(DOMNode *)dst);
          this = dst;
          goto LAB_00262035;
        }
        this_00 = (DOMException *)__cxa_allocate_exception(0x28);
        DOMException::DOMException(this_00,0xb,0,XMLPlatformUtils::fgMemoryManager);
      }
    }
  }
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode* DOMAttrImpl::rename(const XMLCh* namespaceURI, const XMLCh* name)
{
    DOMElement* el = getOwnerElement();
    DOMDocumentImpl* doc = (DOMDocumentImpl*)fParent.fOwnerDocument;

    if (el)
        el->removeAttributeNode(this);

    if (!namespaceURI || !*namespaceURI) {
        fName = doc->getPooledString(name);

        if (el)
            el->setAttributeNode(this);

        // and fire user data NODE_RENAMED event
        castToNodeImpl(this)->callUserDataHandlers(DOMUserDataHandler::NODE_RENAMED, this, this);

        return this;
    }
    else {

        // create a new AttrNS
        DOMAttr* newAttr = doc->createAttributeNS(namespaceURI, name);

        // transfer the userData
        doc->transferUserData(castToNodeImpl(this), castToNodeImpl(newAttr));

        // move children to new node
        DOMNode* child = getFirstChild();
        while (child) {
            removeChild(child);
            newAttr->appendChild(child);
            child = getFirstChild();
        }

        // reattach attr to element
        if (el)
            el->setAttributeNodeNS(newAttr);

        // and fire user data NODE_RENAMED event
        castToNodeImpl(newAttr)->callUserDataHandlers(DOMUserDataHandler::NODE_RENAMED, this, newAttr);

        return newAttr;
    }
}